

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Statement * __thiscall soul::StructuralParser::parseWhileLoop(StructuralParser *this)

{
  LoopStatement *pLVar1;
  Expression *pEVar2;
  Block *o;
  pool_ptr<soul::AST::Statement> local_58;
  pool_ptr<soul::AST::Expression> local_50;
  char *local_48;
  Context local_30;
  LoopStatement *local_18;
  LoopStatement *loopStatement;
  StructuralParser *this_local;
  
  loopStatement = (LoopStatement *)this;
  getContext(&local_30,this);
  pLVar1 = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,&local_30);
  AST::Context::~Context(&local_30);
  local_48 = "(";
  local_18 = pLVar1;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  pEVar2 = parseExpression(this,false);
  pEVar2 = matchCloseParen(this,pEVar2);
  pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::Expression,void>(&local_50,pEVar2);
  (local_18->condition).object = local_50.object;
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  o = parseStatementAsNewBlock(this);
  pool_ptr<soul::AST::Statement>::pool_ptr<soul::AST::Block,void>(&local_58,o);
  (local_18->body).object = local_58.object;
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_58);
  return &local_18->super_Statement;
}

Assistant:

AST::Statement& parseWhileLoop()
    {
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());

        expect (Operator::openParen);
        loopStatement.condition = matchCloseParen (parseExpression());
        loopStatement.body = parseStatementAsNewBlock();

        return loopStatement;
    }